

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void vReport(TidyDocImpl *doc,Node *element,Node *node,uint code,__va_list_tag *args)

{
  TidyMessageImpl *message_00;
  TidyReportLevel level;
  messageFormatter *handler;
  TidyMessageImpl *message;
  va_list args_copy;
  int local_34;
  int i;
  __va_list_tag *args_local;
  uint code_local;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  local_34 = 0;
  while( true ) {
    if (dispatchTable[local_34].code == 0) {
      return;
    }
    if (dispatchTable[local_34].code == code) break;
    local_34 = local_34 + 1;
  }
  args_copy[0].overflow_arg_area = args->reg_save_area;
  message = *(TidyMessageImpl **)args;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  message_00 = (*dispatchTable[local_34].handler)
                         (doc,element,node,code,dispatchTable[local_34].level,
                          (__va_list_tag *)&message);
  messageOut(message_00);
  if (dispatchTable[local_34].next == 0) {
    return;
  }
  args_copy[0].overflow_arg_area = args->reg_save_area;
  message = *(TidyMessageImpl **)args;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  vReport(doc,element,node,dispatchTable[local_34].next,(__va_list_tag *)&message);
  return;
}

Assistant:

static void vReport(TidyDocImpl* doc, Node *element, Node *node, uint code, va_list args)
{
    int i = 0;
    va_list args_copy;

    while ( dispatchTable[i].code != 0 )
    {
        if ( dispatchTable[i].code == code )
        {
            TidyMessageImpl *message;
            messageFormatter *handler = dispatchTable[i].handler;
            TidyReportLevel level = dispatchTable[i].level;

            va_copy(args_copy, args);
            message = handler( doc, element, node, code, level, args_copy );
            va_end(args_copy);

            messageOut( message );

            if ( dispatchTable[i].next )
            {
                va_copy(args_copy, args);
                vReport(doc, element, node, dispatchTable[i].next, args_copy);
                va_end(args_copy);
            }
            break;
        }
        i++;
    }
}